

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall llvm::yaml::Input::beginMapping(Input *this)

{
  bool bVar1;
  ret_type pMVar2;
  MapHNode *MN;
  Input *this_local;
  
  bVar1 = std::error_code::operator_cast_to_bool(&this->EC);
  if ((!bVar1) &&
     (pMVar2 = dyn_cast_or_null<llvm::yaml::Input::MapHNode,llvm::yaml::Input::HNode>
                         (this->CurrentNode), pMVar2 != (ret_type)0x0)) {
    SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::clear(&(pMVar2->ValidKeys).
             super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           );
  }
  return;
}

Assistant:

void Input::beginMapping() {
  if (EC)
    return;
  // CurrentNode can be null if the document is empty.
  MapHNode *MN = dyn_cast_or_null<MapHNode>(CurrentNode);
  if (MN) {
    MN->ValidKeys.clear();
  }
}